

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

void __thiscall cs::token_id::~token_id(token_id *this)

{
  void *in_RSI;
  
  var_id::~var_id(&this->mId);
  token_base::operator_delete(&this->super_token_base,in_RSI);
  return;
}

Assistant:

token_id() = delete;